

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O0

void __thiscall I2cAnalyzer::AdvanceToStartBit(I2cAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  int iVar2;
  I2cAnalyzer *this_local;
  
  do {
    do {
      AnalyzerChannelData::AdvanceToNextEdge();
      iVar2 = AnalyzerChannelData::GetBitState();
    } while (iVar2 != 0);
    pAVar1 = this->mScl;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    iVar2 = AnalyzerChannelData::GetBitState();
  } while (iVar2 != 1);
  RecordStartStopBit(this);
  return;
}

Assistant:

void I2cAnalyzer::AdvanceToStartBit()
{
    for( ;; )
    {
        mSda->AdvanceToNextEdge();

        if( mSda->GetBitState() == BIT_LOW )
        {
            // SDA negedge
            mScl->AdvanceToAbsPosition( mSda->GetSampleNumber() );
            if( mScl->GetBitState() == BIT_HIGH )
                break;
        }
    }

    RecordStartStopBit();
}